

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O1

char * conf_get_str_strs(Conf *conf,int primary,char *subkeyin,char **subkeyout)

{
  int *piVar1;
  char *pcVar2;
  int relation;
  code *cmp;
  tree234 *t;
  constkey key;
  int local_20 [2];
  char *local_18;
  
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x158,"char *conf_get_str_strs(Conf *, int, char *, char **)");
  }
  if (valuetypes[primary] == 3) {
    if (subkeyin == (char *)0x0) {
      local_18 = anon_var_dwarf_34748 + 10;
      t = conf->tree;
      cmp = conf_cmp_constkey;
      relation = 4;
    }
    else {
      t = conf->tree;
      cmp = (cmpfn234)0x0;
      relation = 3;
      local_18 = subkeyin;
    }
    local_20[0] = primary;
    piVar1 = (int *)findrel234(t,local_20,cmp,relation);
    if ((piVar1 == (int *)0x0) || (*piVar1 != primary)) {
      pcVar2 = (char *)0x0;
    }
    else {
      *subkeyout = *(char **)(piVar1 + 2);
      pcVar2 = *(char **)(piVar1 + 4);
    }
    return pcVar2;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x159,"char *conf_get_str_strs(Conf *, int, char *, char **)");
}

Assistant:

char *conf_get_str_strs(Conf *conf, int primary,
                       char *subkeyin, char **subkeyout)
{
    struct constkey key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    if (subkeyin) {
        key.secondary.s = subkeyin;
        entry = findrel234(conf->tree, &key, NULL, REL234_GT);
    } else {
        key.secondary.s = "";
        entry = findrel234(conf->tree, &key, conf_cmp_constkey, REL234_GE);
    }
    if (!entry || entry->key.primary != primary)
        return NULL;
    *subkeyout = entry->key.secondary.s;
    return entry->value.u.stringval;
}